

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O3

void __thiscall Imf_2_5::InputFile::Data::Data(Data *this,int numThreads)

{
  _Rb_tree_header *p_Var1;
  V2f local_20;
  
  *(undefined8 *)((long)&(this->super_Mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->super_Mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->super_Mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->super_Mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->super_Mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_20.x = 0.0;
  local_20.y = 0.0;
  Header::Header(&this->header,0x40,0x40,1.0,&local_20,1.0,INCREASING_Y,ZIP_COMPRESSION);
  this->isTiled = false;
  p_Var1 = &(this->tFileBuffer)._map._M_t._M_impl.super__Rb_tree_header;
  (this->tFileBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->tFileBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->tFile = (TiledInputFile *)0x0;
  this->sFile = (ScanLineInputFile *)0x0;
  this->dsFile = (DeepScanLineInputFile *)0x0;
  (this->tFileBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->tFileBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->tFileBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->cachedBuffer = (FrameBuffer *)0x0;
  this->compositor = (CompositeDeepScanLine *)0x0;
  this->cachedTileY = -1;
  this->numThreads = numThreads;
  this->partNumber = -1;
  this->part = (InputPartData *)0x0;
  this->multiPartBackwardSupport = false;
  this->multiPartFile = (MultiPartInputFile *)0x0;
  this->_streamData = (InputStreamMutex *)0x0;
  this->_deleteStream = false;
  return;
}

Assistant:

InputFile::Data::Data (int numThreads):
    isTiled (false),
    tFile (0),
    sFile (0),
    dsFile(0),
    cachedBuffer (0),
    compositor(0),
    cachedTileY (-1),
    numThreads (numThreads),
    partNumber (-1),
    part(NULL),
    multiPartBackwardSupport (false),
    multiPartFile (0),
    _streamData(0),
    _deleteStream(false)
           
{
    // empty
}